

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hmm.c
# Opt level: O2

void hmm_normalize(hmm_t *h,int32 bestscr)

{
  byte bVar1;
  int iVar2;
  hmm_state_t *phVar3;
  ulong uVar4;
  
  bVar1 = h->n_emit_state;
  phVar3 = h->state;
  for (uVar4 = 0; uVar4 < bVar1; uVar4 = uVar4 + 1) {
    if (-0x38000000 < phVar3->score) {
      phVar3->score = phVar3->score - bestscr;
    }
    phVar3 = phVar3 + 1;
  }
  iVar2 = (h->out).score;
  if (-0x38000000 < iVar2) {
    (h->out).score = iVar2 - bestscr;
  }
  return;
}

Assistant:

void
hmm_normalize(hmm_t *h, int32 bestscr)
{
    int32 i;

    for (i = 0; i < hmm_n_emit_state(h); i++) {
        if (hmm_score(h, i) > WORST_SCORE)
            hmm_score(h, i) -= bestscr;
    }
    if (hmm_out_score(h) > WORST_SCORE)
        hmm_out_score(h) -= bestscr;
}